

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

int __thiscall util::log::logger::rotate_by_size(logger *this,sinker_internal *sinker)

{
  ofstream *poVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  streamoff sVar4;
  char *__old;
  char *__new;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [8];
  string new_file_name;
  char acStack_f8 [8];
  char string1 [128];
  time_t now;
  tm vtm;
  long cur_size;
  sinker_internal *sinker_local;
  logger *this_local;
  
  vtm.tm_zone = (char *)std::ostream::tellp();
  sVar4 = std::fpos::operator_cast_to_long((fpos *)&vtm.tm_zone);
  if (sVar4 < (long)(ulong)(sinker->sk).size) {
    this_local._4_4_ = 0;
  }
  else {
    std::ofstream::close();
    string1._120_8_ = time((time_t *)0x0);
    string1[0x68] = '\0';
    string1[0x69] = '\0';
    string1[0x6a] = '\0';
    string1[0x6b] = '\0';
    string1[0x6c] = '\0';
    string1[0x6d] = '\0';
    string1[0x6e] = '\0';
    string1[0x6f] = '\0';
    string1[0x70] = '\0';
    string1[0x71] = '\0';
    string1[0x72] = '\0';
    string1[0x73] = '\0';
    string1[0x74] = '\0';
    string1[0x75] = '\0';
    string1[0x76] = '\0';
    string1[0x77] = '\0';
    string1[0x58] = '\0';
    string1[0x59] = '\0';
    string1[0x5a] = '\0';
    string1[0x5b] = '\0';
    string1[0x5c] = '\0';
    string1[0x5d] = '\0';
    string1[0x5e] = '\0';
    string1[0x5f] = '\0';
    string1[0x60] = '\0';
    string1[0x61] = '\0';
    string1[0x62] = '\0';
    string1[99] = '\0';
    string1[100] = '\0';
    string1[0x65] = '\0';
    string1[0x66] = '\0';
    string1[0x67] = '\0';
    string1[0x48] = '\0';
    string1[0x49] = '\0';
    string1[0x4a] = '\0';
    string1[0x4b] = '\0';
    string1[0x4c] = '\0';
    string1[0x4d] = '\0';
    string1[0x4e] = '\0';
    string1[0x4f] = '\0';
    string1[0x50] = '\0';
    string1[0x51] = '\0';
    string1[0x52] = '\0';
    string1[0x53] = '\0';
    string1[0x54] = '\0';
    string1[0x55] = '\0';
    string1[0x56] = '\0';
    string1[0x57] = '\0';
    string1[0x38] = '\0';
    string1[0x39] = '\0';
    string1[0x3a] = '\0';
    string1[0x3b] = '\0';
    string1[0x3c] = '\0';
    string1[0x3d] = '\0';
    string1[0x3e] = '\0';
    string1[0x3f] = '\0';
    string1[0x40] = '\0';
    string1[0x41] = '\0';
    string1[0x42] = '\0';
    string1[0x43] = '\0';
    string1[0x44] = '\0';
    string1[0x45] = '\0';
    string1[0x46] = '\0';
    string1[0x47] = '\0';
    string1[0x28] = '\0';
    string1[0x29] = '\0';
    string1[0x2a] = '\0';
    string1[0x2b] = '\0';
    string1[0x2c] = '\0';
    string1[0x2d] = '\0';
    string1[0x2e] = '\0';
    string1[0x2f] = '\0';
    string1[0x30] = '\0';
    string1[0x31] = '\0';
    string1[0x32] = '\0';
    string1[0x33] = '\0';
    string1[0x34] = '\0';
    string1[0x35] = '\0';
    string1[0x36] = '\0';
    string1[0x37] = '\0';
    string1[0x18] = '\0';
    string1[0x19] = '\0';
    string1[0x1a] = '\0';
    string1[0x1b] = '\0';
    string1[0x1c] = '\0';
    string1[0x1d] = '\0';
    string1[0x1e] = '\0';
    string1[0x1f] = '\0';
    string1[0x20] = '\0';
    string1[0x21] = '\0';
    string1[0x22] = '\0';
    string1[0x23] = '\0';
    string1[0x24] = '\0';
    string1[0x25] = '\0';
    string1[0x26] = '\0';
    string1[0x27] = '\0';
    string1[8] = '\0';
    string1[9] = '\0';
    string1[10] = '\0';
    string1[0xb] = '\0';
    string1[0xc] = '\0';
    string1[0xd] = '\0';
    string1[0xe] = '\0';
    string1[0xf] = '\0';
    string1[0x10] = '\0';
    string1[0x11] = '\0';
    string1[0x12] = '\0';
    string1[0x13] = '\0';
    string1[0x14] = '\0';
    string1[0x15] = '\0';
    string1[0x16] = '\0';
    string1[0x17] = '\0';
    acStack_f8[0] = '\0';
    acStack_f8[1] = '\0';
    acStack_f8[2] = '\0';
    acStack_f8[3] = '\0';
    acStack_f8[4] = '\0';
    acStack_f8[5] = '\0';
    acStack_f8[6] = '\0';
    acStack_f8[7] = '\0';
    string1[0] = '\0';
    string1[1] = '\0';
    string1[2] = '\0';
    string1[3] = '\0';
    string1[4] = '\0';
    string1[5] = '\0';
    string1[6] = '\0';
    string1[7] = '\0';
    localtime_r((time_t *)(string1 + 0x78),(tm *)&now);
    strftime(acStack_f8,0x80,"%Y%m%d%H%M%S",(tm *)&now);
    std::operator+(local_138,(char *)&(sinker->sk).log_file);
    std::operator+(local_118,(char *)local_138);
    std::__cxx11::string::~string((string *)local_138);
    __old = (char *)std::__cxx11::string::c_str();
    __new = (char *)std::__cxx11::string::c_str();
    rename(__old,__new);
    poVar1 = sinker->m_ofs;
    _Var3 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_app);
    std::ofstream::open((char *)poVar1,_Var3);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      this_local._4_4_ = -1;
    }
    else {
      sinker->cur_line = 0;
      this_local._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_118);
  }
  return this_local._4_4_;
}

Assistant:

int logger::rotate_by_size(sinker_internal & sinker) {
            long cur_size = sinker.m_ofs->tellp();
            if (cur_size < sinker.sk.size) {
                return 0;
            }

            //1.close old log file
            sinker.m_ofs->close();

            //2.rename old log
            struct tm vtm;
            time_t now = time(0);
            char string1[128] = {0};
            localtime_r(&(now), &vtm);
            strftime(string1, 128, "%Y%m%d%H%M%S", &vtm);
            string new_file_name = sinker.sk.log_file + "." + string1;
#ifdef USE_BOOST
            rename(path(sinker.sk.log_file), path(new_file_name));
#else
            rename(sinker.sk.log_file.c_str(), new_file_name.c_str());
#endif
            //3.open new log file
            sinker.m_ofs->open(sinker.sk.log_file.c_str(), ios_base::out | ios_base::app);
            if (!sinker.m_ofs->is_open()) {
                return -1;
            }
            sinker.cur_line = 0;

            return 0;
        }